

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O2

void * dec_vproc_thread(void *data)

{
  Mpp *buffer;
  HalTaskGroup group;
  MppThread *this;
  MppBufSlots slots;
  code *pcVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  char cVar4;
  MppThreadStatus MVar5;
  MPP_RET MVar6;
  RK_U32 RVar7;
  RK_U32 RVar8;
  RK_U32 RVar9;
  MppBuffer pvVar10;
  size_t size;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar11;
  Mpp *buffer_00;
  int iVar12;
  ulong uVar13;
  MppFrame frm;
  Mpp *local_128;
  HalTaskHnd task;
  RK_S32 tmp;
  Mpp *local_110;
  AutoMutex autolock;
  HalTaskInfo task_info;
  
  local_110 = *data;
  group = *(HalTaskGroup *)((long)data + 8);
  this = *(MppThread **)((long)data + 0x18);
  slots = *(MppBufSlots *)((long)local_110->mDec + 0x30);
  task = (HalTaskHnd)0x0;
  if (((byte)mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec_vproc","mpp_dec_post_proc_thread started\n",(char *)0x0);
  }
  buffer = (Mpp *)((long)data + 0xb8);
  buffer_00 = (Mpp *)((long)data + 0xc0);
  do {
    autolock.mEnabled = 1;
    autolock.mLock = &this->mMutexCond[0].mLock;
    pthread_mutex_lock((pthread_mutex_t *)this->mMutexCond);
    MVar5 = MppThread::get_status(this,THREAD_WORK);
    iVar12 = 5;
    if (MVar5 == MPP_THREAD_RUNNING) {
      iVar12 = 0;
      if ((*(int *)((long)data + 0x90) != 0) && (iVar12 = 0, *(int *)((long)data + 0x20) == 0)) {
        if ((vproc_debug & 2) != 0) {
          _mpp_log_l(4,"mpp_dec_vproc","vproc thread wait %d","dec_vproc_thread");
        }
        iVar12 = 0;
        MppThread::wait(this,(void *)0x0);
      }
    }
    Mutex::Autolock::~Autolock(&autolock);
    if (MVar5 == MPP_THREAD_RUNNING) {
      if ((*(byte *)((long)data + 0x8c) & 1) == 0) {
        MVar6 = hal_task_get_hnd(group,1,&task);
        if (MVar6 == MPP_OK) {
          *(byte *)((long)data + 0x8c) = *(byte *)((long)data + 0x8c) | 1;
          *(byte *)((long)data + 0x90) = *(byte *)((long)data + 0x90) & 0xfe;
          goto LAB_00175c65;
        }
        if (*(int *)((long)data + 0x20) == 0) {
          *(byte *)((long)data + 0x90) = *(byte *)((long)data + 0x90) | 1;
        }
        else {
          if ((vproc_debug & 4) != 0) {
            _mpp_log_l(4,"mpp_dec_vproc","reset start\n","dec_vproc_thread");
          }
          dec_vproc_clr_prev((MppDecVprocCtxImpl *)data);
          pthread_mutex_lock((pthread_mutex_t *)(this->mMutexCond + 3));
          *(undefined4 *)((long)data + 0x20) = 0;
          pthread_mutex_unlock((pthread_mutex_t *)(this->mMutexCond + 3));
          sem_post((sem_t *)((long)data + 0x28));
          *(undefined4 *)((long)data + 0x90) = 0;
          iVar12 = 4;
          if ((vproc_debug & 4) == 0) goto LAB_0017621b;
          _mpp_log_l(4,"mpp_dec_vproc","reset done\n","dec_vproc_thread");
        }
      }
      else {
LAB_00175c65:
        iVar12 = 0;
        if (task == (HalTaskHnd)0x0) goto LAB_0017621b;
        MVar6 = hal_task_hnd_get_info(task,&task_info);
        if ((MVar6 != MPP_OK) &&
           (_mpp_log_l(2,"mpp_dec_vproc","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "ret == MPP_OK","dec_vproc_thread",0x377), (mpp_debug._3_1_ & 0x10) != 0))
        goto LAB_0017627f;
        uVar3 = task_info.dec_vproc.input;
        uVar2 = task_info.dec.valid._0_1_;
        uVar13 = (ulong)(uint)task_info.dec_vproc.input;
        frm = (MppFrame)0x0;
        if ((task_info.dec_vproc.input < 0 & task_info.dec.valid._0_1_) == 1) {
          if ((vproc_debug & 2) != 0) {
            _mpp_log_l(4,"mpp_dec_vproc","eos signal\n","dec_vproc_thread");
          }
          mpp_frame_init(&frm);
          mpp_frame_set_eos(frm,1);
          if ((vproc_debug & 0x80) != 0) {
            mpp_frame_get_poc(frm);
            _mpp_log_l(4,"mpp_dec_vproc","output at eos, frame poc %d\n","dec_vproc_thread");
          }
          dec_vproc_put_frame(local_110,frm,(MppBuffer)0x0,-1,0);
          dec_vproc_clr_prev((MppDecVprocCtxImpl *)data);
          mpp_frame_deinit(&frm);
        }
        else {
          mpp_buf_slot_get_prop(slots,task_info.dec_vproc.input,SLOT_FRAME_PTR,&frm);
          cVar4 = (char)vproc_debug;
          if ((uVar2 & 2) == 0) {
            if ((vproc_debug & 2) != 0) {
              _mpp_log_l(4,"mpp_dec_vproc","vproc get buf in","dec_vproc_thread");
            }
            if (((*(byte *)((long)data + 0x8c) & 2) == 0) && (*(int *)((long)data + 0x20) == 0)) {
              pvVar10 = mpp_frame_get_buffer(frm);
              size = mpp_buffer_get_size_with_caller(pvVar10,"dec_vproc_thread");
              if (buffer->mPktIn == (mpp_list *)0x0) {
                local_128 = buffer;
                mpp_buffer_get_with_tag
                          (local_110->mFrameGroup,(MppBuffer *)buffer,size,"mpp_dec_vproc",
                           "dec_vproc_thread");
                if ((vproc_debug & 0x80) != 0) {
                  mpp_buffer_get_ptr_with_caller(local_128->mPktIn,"dec_vproc_thread");
                  _mpp_log_l(4,"mpp_dec_vproc","get out buf0 ptr %p\n","dec_vproc_thread");
                }
                if (local_128->mPktIn == (mpp_list *)0x0) {
                  *(byte *)((long)data + 0x90) = *(byte *)((long)data + 0x90) | 2;
                  goto LAB_00176218;
                }
              }
              if (buffer_00->mPktIn == (mpp_list *)0x0) {
                local_128 = buffer_00;
                mpp_buffer_get_with_tag
                          (local_110->mFrameGroup,&buffer_00->mPktIn,size,"mpp_dec_vproc",
                           "dec_vproc_thread");
                if ((vproc_debug & 0x80) != 0) {
                  mpp_buffer_get_ptr_with_caller(local_128->mPktIn,"dec_vproc_thread");
                  _mpp_log_l(4,"mpp_dec_vproc","get out buf1 ptr %p\n","dec_vproc_thread");
                }
                if (local_128->mPktIn == (mpp_list *)0x0) {
                  *(byte *)((long)data + 0x90) = *(byte *)((long)data + 0x90) | 2;
                  buffer_00 = local_128;
                  goto LAB_00176218;
                }
              }
              *(byte *)((long)data + 0x8c) = *(byte *)((long)data + 0x8c) | 2;
            }
            tmp = -1;
            mpp_buf_slot_dequeue(slots,&tmp,QUEUE_DEINTERLACE);
            if ((tmp != uVar3) &&
               (_mpp_log_l(2,"mpp_dec_vproc","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "tmp == index","dec_vproc_thread",0x3b5), (mpp_debug._3_1_ & 0x10) != 0))
            {
LAB_0017627f:
              abort();
            }
            if ((vproc_debug & 2) != 0) {
              _mpp_log_l(4,"mpp_dec_vproc","vproc get buf ready & start process ","dec_vproc_thread"
                        );
            }
            if ((*(int *)((long)data + 0x20) == 0) && (*(long *)((long)data + 0x48) != 0)) {
              if ((vproc_debug & 0x40) != 0) {
                RVar7 = mpp_frame_get_poc(frm);
                local_128 = (Mpp *)CONCAT44(local_128._4_4_,RVar7);
                RVar7 = mpp_frame_get_mode(frm);
                RVar8 = mpp_frame_get_errinfo(frm);
                RVar9 = mpp_frame_get_discard(frm);
                pvVar10 = mpp_frame_get_buffer(frm);
                pvVar11 = mpp_buffer_get_ptr_with_caller(pvVar10,"dec_vproc_thread");
                _mpp_log_l(4,"mpp_dec_vproc",
                           "processing frame poc %d, mode 0x%x, err %x vs %x, buf slot %x, ptr %p\n"
                           ,"dec_vproc_thread",(ulong)local_128 & 0xffffffff,(ulong)RVar7,
                           CONCAT44(extraout_var,RVar8),CONCAT44(extraout_var_00,RVar9),uVar13,
                           pvVar11);
              }
              (**(code **)((long)data + 0xd0))(data,frm);
            }
            autolock._0_8_ = frm;
            local_128 = *data;
            (**(code **)((long)data + 0xe0))(data,frm,uVar3);
            if ((uVar2 & 1) != 0) {
              mpp_frame_init((MppFrame *)&autolock);
              mpp_frame_set_eos((MppFrame)autolock._0_8_,1);
              if ((vproc_debug & 0x80) != 0) {
                mpp_frame_get_poc((MppFrame)autolock._0_8_);
                _mpp_log_l(4,"mpp_dec_vproc","output at update ref, frame poc %d\n",
                           "dec_vproc_update_ref");
              }
              dec_vproc_put_frame(local_128,(MppFrame)autolock._0_8_,(MppBuffer)0x0,-1,0);
              dec_vproc_clr_prev((MppDecVprocCtxImpl *)data);
              mpp_frame_deinit((MppFrame *)&autolock);
            }
            hal_task_hnd_set_status(task,0);
            *(undefined8 *)((long)data + 0x8c) = 0;
            if ((vproc_debug & 2) != 0) {
              _mpp_log_l(4,"mpp_dec_vproc","vproc task done","dec_vproc_thread");
            }
            goto LAB_0017621b;
          }
          if ((vproc_debug & 2) != 0) {
            _mpp_log_l(4,"mpp_dec_vproc","info change\n","dec_vproc_thread");
            cVar4 = (char)vproc_debug;
          }
          if (cVar4 < '\0') {
            mpp_frame_get_poc(frm);
            _mpp_log_l(4,"mpp_dec_vproc","output at info change, frame poc %d\n","dec_vproc_thread")
            ;
          }
          dec_vproc_put_frame(local_110,frm,(MppBuffer)0x0,-1,0);
          dec_vproc_clr_prev((MppDecVprocCtxImpl *)data);
          pcVar1 = *(code **)(**(long **)((long)data + 0x50) + 0x18);
          if (pcVar1 != (code *)0x0) {
            (*pcVar1)(*(undefined8 *)((long)data + 0x48));
          }
        }
        hal_task_hnd_set_status(task,0);
        *(byte *)((long)data + 0x8c) = *(byte *)((long)data + 0x8c) & 0xfe;
      }
LAB_00176218:
      iVar12 = 4;
    }
LAB_0017621b:
    if (iVar12 == 5) {
      if (((byte)mpp_debug & 4) != 0) {
        _mpp_log_l(4,"mpp_dec_vproc","mpp_dec_post_proc_thread exited\n",(char *)0x0);
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

static void *dec_vproc_thread(void *data)
{
    MppDecVprocCtxImpl *ctx = (MppDecVprocCtxImpl *)data;
    HalTaskGroup tasks = ctx->task_group;
    MppThread *thd = ctx->thd;
    Mpp *mpp = ctx->mpp;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots slots = dec->frame_slots;

    HalTaskHnd task = NULL;
    HalTaskInfo task_info;
    HalDecVprocTask *task_vproc = &task_info.dec_vproc;

    mpp_dbg_info("mpp_dec_post_proc_thread started\n");

    while (1) {
        MPP_RET ret = MPP_OK;

        {
            AutoMutex autolock(thd->mutex());

            if (MPP_THREAD_RUNNING != thd->get_status())
                break;

            if (ctx->task_wait.val && !ctx->reset) {
                vproc_dbg_status("vproc thread wait %d", ctx->task_wait.val);
                thd->wait();
            }
        }

        if (!ctx->task_status.task_rdy) {
            if (hal_task_get_hnd(tasks, TASK_PROCESSING, &task)) {
                if (ctx->reset) {
                    /* reset only on all task finished */
                    vproc_dbg_reset("reset start\n");

                    dec_vproc_clr_prev(ctx);

                    thd->lock(THREAD_CONTROL);
                    ctx->reset = 0;
                    thd->unlock(THREAD_CONTROL);
                    sem_post(&ctx->reset_sem);
                    ctx->task_wait.val = 0;

                    vproc_dbg_reset("reset done\n");
                    continue;
                }

                ctx->task_wait.task_in = 1;
                continue;
            }
            ctx->task_status.task_rdy = 1;
            ctx->task_wait.task_in = 0;
        }

        if (task) {
            ret = hal_task_hnd_get_info(task, &task_info);

            mpp_assert(ret == MPP_OK);

            RK_S32 index = task_vproc->input;
            RK_U32 eos = task_vproc->flags.eos;
            RK_U32 change = task_vproc->flags.info_change;
            MppFrame frm = NULL;

            if (eos && index < 0) {
                vproc_dbg_status("eos signal\n");

                mpp_frame_init(&frm);
                mpp_frame_set_eos(frm, eos);
                vproc_dbg_out("output at eos, frame poc %d\n", mpp_frame_get_poc(frm));
                dec_vproc_put_frame(mpp, frm, NULL, -1, 0);
                dec_vproc_clr_prev(ctx);
                mpp_frame_deinit(&frm);

                hal_task_hnd_set_status(task, TASK_IDLE);
                ctx->task_status.task_rdy = 0;
                continue;
            }

            mpp_buf_slot_get_prop(slots, index, SLOT_FRAME_PTR, &frm);

            if (change) {
                vproc_dbg_status("info change\n");
                vproc_dbg_out("output at info change, frame poc %d\n", mpp_frame_get_poc(frm));
                dec_vproc_put_frame(mpp, frm, NULL, -1, 0);
                dec_vproc_clr_prev(ctx);

                if (ctx->com_ctx->ops->reset)
                    ctx->com_ctx->ops->reset(ctx->iep_ctx);

                hal_task_hnd_set_status(task, TASK_IDLE);
                ctx->task_status.task_rdy = 0;
                continue;
            }
            vproc_dbg_status("vproc get buf in");
            if (!ctx->task_status.buf_rdy && !ctx->reset) {
                MppBuffer buf = mpp_frame_get_buffer(frm);
                size_t buf_size = mpp_buffer_get_size(buf);
                if (!ctx->out_buf0) {
                    mpp_buffer_get(mpp->mFrameGroup, &ctx->out_buf0, buf_size);
                    vproc_dbg_out("get out buf0 ptr %p\n", mpp_buffer_get_ptr(ctx->out_buf0));
                    if (NULL == ctx->out_buf0) {
                        ctx->task_wait.task_buf_in = 1;
                        continue;
                    }
                }
                if (!ctx->out_buf1) {
                    mpp_buffer_get(mpp->mFrameGroup, &ctx->out_buf1, buf_size);
                    vproc_dbg_out("get out buf1 ptr %p\n", mpp_buffer_get_ptr(ctx->out_buf1));
                    if (NULL == ctx->out_buf1) {
                        ctx->task_wait.task_buf_in = 1;
                        continue;
                    }
                }
                ctx->task_status.buf_rdy = 1;
            }

            RK_S32 tmp = -1;
            mpp_buf_slot_dequeue(slots, &tmp, QUEUE_DEINTERLACE);
            mpp_assert(tmp == index);

            vproc_dbg_status("vproc get buf ready & start process ");
            if (!ctx->reset && ctx->iep_ctx) {
                vproc_dbg_in("processing frame poc %d, mode 0x%x, err %x vs %x, buf slot %x, ptr %p\n",
                             mpp_frame_get_poc(frm), mpp_frame_get_mode(frm), mpp_frame_get_errinfo(frm),
                             mpp_frame_get_discard(frm), index, mpp_buffer_get_ptr(mpp_frame_get_buffer(frm)));
                ctx->set_dei((MppDecVprocCtx *)ctx, frm);
            }

            dec_vproc_update_ref(ctx, frm, index, eos);
            hal_task_hnd_set_status(task, TASK_IDLE);
            ctx->task_status.val = 0;
            ctx->task_wait.val = 0;

            vproc_dbg_status("vproc task done");
        }
    }
    mpp_dbg_info("mpp_dec_post_proc_thread exited\n");

    return NULL;
}